

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt * __thiscall slang::SVInt::operator--(SVInt *this)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  bool bVar3;
  uint64_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  
  uVar7 = (this->super_SVIntStorage).bitWidth;
  bVar3 = (this->super_SVIntStorage).unknownFlag;
  if (uVar7 < 0x41 && (bVar3 & 1U) == 0) {
    (this->super_SVIntStorage).field_0.pVal =
         (uint64_t *)((this->super_SVIntStorage).field_0.val - 1);
  }
  else if ((bVar3 & 1U) == 0) {
    uVar7 = uVar7 + 0x3f;
    if (0x3f < uVar7) {
      puVar4 = (this->super_SVIntStorage).field_0.pVal;
      bVar9 = false;
      lVar8 = 0;
      do {
        puVar1 = puVar4 + lVar8;
        uVar5 = (ulong)bVar9;
        uVar2 = *puVar1;
        uVar6 = *puVar1 - 1;
        bVar9 = uVar2 == 0 || uVar6 < uVar5;
        *puVar1 = uVar6 - uVar5;
        if (uVar2 != 0 && uVar6 >= uVar5) break;
        bVar10 = (ulong)((uVar7 >> 6) << (bVar3 & 0x1fU)) - 1 != lVar8;
        lVar8 = lVar8 + 1;
      } while (bVar10);
    }
  }
  else {
    setAllX(this);
  }
  clearUnusedBits(this);
  return this;
}

Assistant:

SVInt& SVInt::operator--() {
    if (isSingleWord())
        --val;
    else if (unknownFlag)
        setAllX();
    else
        subOne(pVal, pVal, getNumWords(), 1);
    clearUnusedBits();
    return *this;
}